

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

void __thiscall
txpackage_tests::package_submission_tests::test_method(package_submission_tests *this)

{
  long lVar1;
  element_type *peVar2;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  CKey input_signing_key_02;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  unsigned_long uVar7;
  Chainstate *pCVar8;
  iterator iVar9;
  iterator iVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  int64_t iVar13;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *pvVar14;
  long lVar15;
  iterator pvVar16;
  CTxMemPool *pCVar17;
  PackageMempoolAcceptResult *client_maxfeerate;
  iterator pvVar18;
  CMutableTransaction *pCVar19;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poVar20;
  Package *pPVar21;
  pointer ptVar22;
  TestChain100Setup *pTVar23;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  CTransactionRef input_transaction_02;
  check_type cVar29;
  check_type cVar30;
  uint *puVar24;
  pointer pCVar25;
  Wtxid *pWVar26;
  undefined4 in_stack_fffffffffffff4ac;
  undefined4 uVar27;
  undefined8 in_stack_fffffffffffff4b0;
  TestChain100Setup *pTVar28;
  CKey *other;
  CAmount in_stack_fffffffffffff4c8;
  undefined1 submit;
  undefined8 in_stack_fffffffffffff4d0;
  undefined1 *local_b28;
  undefined1 *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  undefined1 *local_ac8;
  undefined1 *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined4 local_6e4;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  Package package_invalid_parent;
  CTransactionRef tx_parent_invalid;
  CScriptWitness bad_witness;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  CTransactionRef tx_grandchild;
  CKey local_570;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_560;
  CKey grandchild_key;
  CTransactionRef tx_child;
  CKey local_530;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_520;
  CKey child_key;
  CTransactionRef tx_parent;
  CKey local_4f0;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_4e0;
  CMutableTransaction mtx_parent;
  Package package_3gen;
  Package package_parent_child;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  CKey local_398;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_388;
  Package package_unrelated;
  CKey parent_key;
  uint expected_pool_size;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  Package package_missing_parent;
  undefined1 local_318 [16];
  shared_count asStack_308 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_parent_invalid;
  CMutableTransaction mtx_parent_invalid;
  PackageMempoolAcceptResult result_3gen_submit;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_218;
  CScript grandchild_locking_script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_1d8;
  CMutableTransaction mtx_child;
  CMutableTransaction mtx_grandchild;
  CScript child_locking_script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_118;
  PackageMempoolAcceptResult result_unrelated_submit;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_78;
  CScript parent_locking_script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock16,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
             ,0x164,false);
  uVar7 = CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                           super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node
                           .mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  expected_pool_size = (uint)uVar7;
  GenerateRandomKey(SUB81(&parent_key,0));
  CKey::GetPubKey((CPubKey *)&result_3gen_submit,&parent_key);
  PKHash::PKHash((PKHash *)&mtx_grandchild,(CPubKey *)&result_3gen_submit);
  result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length._0_4_ =
       mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_unrelated_submit.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination(&parent_locking_script,(CTxDestination *)&result_unrelated_submit);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_unrelated_submit);
  package_unrelated.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_unrelated.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_unrelated.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  other = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey;
  for (lVar15 = 400; submit = (undefined1)in_stack_fffffffffffff4d0, lVar15 != 0x230;
      lVar15 = lVar15 + 0x10) {
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_388,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((((TestChain100Setup *)this)->m_coinbase_txns).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar15));
    CKey::CKey(&local_398,other);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              (&local_78,&parent_locking_script.super_CScriptBase);
    _cVar29 = 4900000000;
    input_signing_key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )0x124101100;
    input_signing_key._0_8_ = &local_78;
    auVar3._4_8_ = in_stack_fffffffffffff4b0;
    auVar3._0_4_ = in_stack_fffffffffffff4ac;
    auVar3._12_8_ = this;
    auVar3._20_8_ = other;
    auVar3._28_4_ = 0;
    input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_388;
    TestChain100Setup::CreateValidMempoolTransaction
              ((CMutableTransaction *)&result_unrelated_submit,(TestChain100Setup *)this,
               input_transaction,0,(int)&local_398,input_signing_key,(CScript)(auVar3 << 0x20),
               in_stack_fffffffffffff4c8,SUB81(in_stack_fffffffffffff4d0,0));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_78);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&local_398.keydata);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
    std::make_shared<CTransaction_const,CMutableTransaction&>
              ((CMutableTransaction *)&result_3gen_submit);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&package_unrelated,(shared_ptr<const_CTransaction> *)&result_3gen_submit);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&result_unrelated_submit);
  }
  pTVar28 = (TestChain100Setup *)this;
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate = &result_3gen_submit;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  pvVar16 = (iterator)0x0;
  ProcessNewPackage(&result_unrelated_submit,pCVar8,
                    (((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_unrelated,false
                    ,(optional<CFeeRate> *)client_maxfeerate);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)client_maxfeerate;
  msg.m_begin = pvVar16;
  file.m_end = (iterator)0x175;
  file.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3b8,msg);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         result_unrelated_submit.m_state.
                         super_ValidationState<PackageValidationResult>.m_mode == M_INVALID);
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_124d637;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc62e07;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3c0 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = (iterator)0x0;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_grandchild,(lazy_ostream *)&result_3gen_submit,1,0,WARN,
             _cVar29,(size_t)&local_3c8,0x175);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar18;
  msg_00.m_begin = pvVar16;
  file_00.m_end = (iterator)0x176;
  file_00.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3e8,
             msg_00);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01139f30;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3f0 = "";
  pCVar19 = &mtx_grandchild;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         result_unrelated_submit.m_state.
                         super_ValidationState<PackageValidationResult>.m_result);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&result_3gen_submit,&local_3f8,0x176,1,2,pCVar19,0xc62e08,&mtx_parent,0xc62342);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pCVar19;
  msg_01.m_begin = pvVar16;
  file_01.m_end = (iterator)0x177;
  file_01.m_begin = (iterator)&local_408;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_418,
             msg_01);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01139f30;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_420 = "";
  std::__cxx11::string::string
            ((string *)&mtx_grandchild,
             &result_unrelated_submit.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason);
  pvVar16 = (iterator)0x2;
  pCVar19 = &mtx_grandchild;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[31]>
            (&result_3gen_submit,&local_428,0x177,1,2,pCVar19,0xc62e34,
             "package-not-child-with-parents",0xc62e85);
  std::__cxx11::string::~string((string *)&mtx_grandchild);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar19;
  msg_02.m_begin = pvVar16;
  file_02.m_end = (iterator)0x178;
  file_02.m_begin = (iterator)&local_438;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_448,
             msg_02);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01139f30;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_450 = "";
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((((TestChain100Setup *)this)->super_TestingSetup).
                                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t
                                 .
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  uVar27 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&result_3gen_submit,&local_458,0x178);
  package_parent_child.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_parent_child.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_parent_child.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_3gen.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_3gen.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_3gen.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4e0,
             &((((TestChain100Setup *)this)->m_coinbase_txns).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_4f0,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_118,&parent_locking_script.super_CScriptBase);
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_00._0_8_ = &local_118;
  auVar4._4_8_ = in_stack_fffffffffffff4b0;
  auVar4._0_4_ = uVar27;
  auVar4._12_8_ = pTVar28;
  auVar4._20_8_ = other;
  auVar4._28_4_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_4e0;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,(TestChain100Setup *)this,input_transaction_00,0,(int)&local_4f0,
             input_signing_key_00,(CScript)(auVar4 << 0x20),in_stack_fffffffffffff4c8,(bool)submit);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_118);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_4f0.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e0._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_parent_child,&tx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_3gen,&tx_parent);
  GenerateRandomKey(SUB81(&child_key,0));
  CKey::GetPubKey((CPubKey *)&mtx_grandchild,&child_key);
  PKHash::PKHash((PKHash *)&mtx_child,(CPubKey *)&mtx_grandchild);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_3gen_submit.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination(&child_locking_script,(CTxDestination *)&result_3gen_submit);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_3gen_submit);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_520,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_530,&parent_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_1d8,&child_locking_script.super_CScriptBase);
  input_signing_key_01.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x11e1a3000;
  input_signing_key_01._0_8_ = &local_1d8;
  auVar5._4_8_ = in_stack_fffffffffffff4b0;
  auVar5._0_4_ = uVar27;
  auVar5._12_8_ = pTVar28;
  auVar5._20_8_ = other;
  auVar5._28_4_ = 0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_520;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child,(TestChain100Setup *)this,input_transaction_01,0x65,(int)&local_530,
             input_signing_key_01,(CScript)(auVar5 << 0x20),in_stack_fffffffffffff4c8,(bool)submit);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_1d8);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_530.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_520._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_child);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_parent_child,&tx_child);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_3gen,&tx_child);
  GenerateRandomKey(SUB81(&grandchild_key,0));
  CKey::GetPubKey((CPubKey *)&mtx_grandchild,&grandchild_key);
  PKHash::PKHash((PKHash *)&mtx_parent_invalid,(CPubKey *)&mtx_grandchild);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)CONCAT71(mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,
                         mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_finish._0_1_);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_3gen_submit.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination(&grandchild_locking_script,(CTxDestination *)&result_3gen_submit);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_3gen_submit);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_560,&tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
            );
  CKey::CKey(&local_570,&child_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_218,&grandchild_locking_script.super_CScriptBase);
  _cVar30 = 4700000000;
  input_signing_key_02.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x118244f00;
  input_signing_key_02._0_8_ = &local_218;
  auVar6._4_8_ = in_stack_fffffffffffff4b0;
  auVar6._0_4_ = uVar27;
  auVar6._12_8_ = pTVar28;
  auVar6._20_8_ = other;
  auVar6._28_4_ = 0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_560;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_grandchild,(TestChain100Setup *)this,input_transaction_02,0x65,(int)&local_570,
             input_signing_key_02,(CScript)(auVar6 << 0x20),in_stack_fffffffffffff4c8,(bool)submit);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_218);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_570.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_560._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_grandchild);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_3gen,&tx_grandchild);
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar19 = &mtx_parent_invalid;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  pvVar16 = (iterator)0x0;
  ProcessNewPackage(&result_3gen_submit,pCVar8,
                    (((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_3gen,false,
                    (optional<CFeeRate> *)pCVar19);
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar19;
  msg_03.m_begin = pvVar16;
  file_03.m_end = (iterator)0x19c;
  file_03.m_begin = (iterator)&local_590;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5a0,
             msg_03);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode == M_INVALID
  ;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  local_318._0_8_ = "result_3gen_submit.m_state.IsInvalid()";
  local_318._8_8_ = "";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5a8 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             _cVar30,(size_t)&local_5b0,0x19c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar18;
  msg_04.m_begin = pvVar16;
  file_04.m_end = (iterator)0x19d;
  file_04.m_begin = (iterator)&local_5c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_5d0,
             msg_04);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5d8 = "";
  poVar20 = &err_parent_invalid;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_4_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result;
  local_318._0_4_ = 1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&mtx_parent_invalid,&local_5e0,0x19d,1,2,poVar20,0xc62ee0,(pointer)local_318,0xc62342);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)poVar20;
  msg_05.m_begin = pvVar16;
  file_05.m_end = (iterator)0x19e;
  file_05.m_begin = (iterator)&local_5f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_600,
             msg_05);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_608 = "";
  std::__cxx11::string::string
            ((string *)&err_parent_invalid,
             &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason);
  pvVar16 = (iterator)0x2;
  poVar20 = &err_parent_invalid;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[31]>
            (&mtx_parent_invalid,&local_610,0x19e,1,2,poVar20,0xc62f07,
             "package-not-child-with-parents",0xc62e85);
  std::__cxx11::string::~string((string *)&err_parent_invalid);
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)poVar20;
  msg_06.m_begin = pvVar16;
  file_06.m_end = (iterator)0x19f;
  file_06.m_begin = (iterator)&local_620;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_630,
             msg_06);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_638 = "";
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       CTxMemPool::size((((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  puVar24 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&mtx_parent_invalid,&local_640,0x19f,1,2,&err_parent_invalid,0xc629c5,puVar24,0xc62ea6)
  ;
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_3gen_submit);
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode = M_INVALID;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&bad_witness.stack,(int *)&result_3gen_submit);
  CMutableTransaction::CMutableTransaction(&mtx_parent_invalid,&mtx_parent);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&bad_witness.stack);
  std::make_shared<CTransaction_const,CMutableTransaction&>
            ((CMutableTransaction *)&tx_parent_invalid);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&result_3gen_submit,
             &tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_string_length,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)&result_3gen_submit;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_invalid_parent,__l,(allocator_type *)&err_parent_invalid);
  lVar15 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                       m_mode + lVar15));
    lVar15 = lVar15 + -0x10;
  } while (lVar15 != -8);
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  poVar20 = &err_parent_invalid;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
  ProcessNewPackage(&result_3gen_submit,pCVar8,
                    (((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_invalid_parent,
                    false,(optional<CFeeRate> *)poVar20);
  pCVar17 = (((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (&err_parent_invalid,&package_invalid_parent,&result_3gen_submit,false,pCVar17);
  if (err_parent_invalid.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_690 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_688 = "";
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = (iterator)poVar20;
    msg_07.m_begin = (iterator)pCVar17;
    file_07.m_end = (iterator)0x1ae;
    file_07.m_begin = (iterator)&local_690;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_6a0,
               msg_07);
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)package_missing_parent.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (err_parent_invalid.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_0054c7bb;
    }
    local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
    local_318._0_8_ = &PTR__lazy_ostream_01139e30;
    asStack_308[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_6b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6a8 = "";
    pvVar16 = &DAT_00000001;
    pPVar21 = (Package *)&DAT_00000001;
    asStack_308[1].pi_ = (sp_counted_base *)&err_parent_invalid;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&package_missing_parent,(lazy_ostream *)local_318,1,1,WARN,
               (check_type)puVar24,(size_t)&local_6b0,0x1ae);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &package_missing_parent.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    iVar9 = std::
            _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            ::find(&result_3gen_submit.m_tx_results._M_t,
                   &((tx_parent_invalid.
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_witness_hash).m_wrapped);
    iVar10 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_3gen_submit.m_tx_results._M_t,
                    &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    local_6c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6b8 = "";
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = (iterator)poVar20;
    msg_08.m_begin = (iterator)pCVar17;
    file_08.m_end = (iterator)0x1b2;
    file_08.m_begin = (iterator)&local_6c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_6d0,
               msg_08);
    local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
    local_318._0_8_ = &PTR__lazy_ostream_01139f30;
    asStack_308[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_308[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_6e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6d8 = "";
    pPVar21 = &package_missing_parent;
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(package_missing_parent.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)((long)&iVar9._M_node[2]._M_parent + 4));
    local_6e4 = 7;
    pvVar16 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
              (local_318,&local_6e0,0x1b2,1,2,pPVar21,0xc62f34,&local_6e4,0xc62f5a);
    local_6f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6f0 = "";
    local_708 = &boost::unit_test::basic_cstring<char_const>::null;
    local_700 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = (iterator)pPVar21;
    msg_09.m_begin = pvVar16;
    file_09.m_end = (iterator)0x1b3;
    file_09.m_begin = (iterator)&local_6f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_708,
               msg_09);
    local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
    local_318._0_8_ = &PTR__lazy_ostream_01139f30;
    asStack_308[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_308[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_718 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_710 = "";
    std::__cxx11::string::string
              ((string *)&package_missing_parent,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iVar9._M_node[2]._M_left);
    pvVar16 = (iterator)0x2;
    pPVar21 = &package_missing_parent;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
              (local_318,&local_718,0x1b3,1,2,pPVar21,0xc62f81,"bad-witness-nonstandard",0xc62fc5);
    std::__cxx11::string::~string((string *)&package_missing_parent);
    local_728 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_720 = "";
    local_738 = &boost::unit_test::basic_cstring<char_const>::null;
    local_730 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = (iterator)pPVar21;
    msg_10.m_begin = pvVar16;
    file_10.m_end = (iterator)0x1b4;
    file_10.m_begin = (iterator)&local_728;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_738,
               msg_10);
    local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
    local_318._0_8_ = &PTR__lazy_ostream_01139f30;
    asStack_308[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_308[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_748 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_740 = "";
    pPVar21 = &package_missing_parent;
    package_missing_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(package_missing_parent.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)((long)&iVar10._M_node[2]._M_parent + 4));
    local_6e4 = 5;
    pvVar16 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
              (local_318,&local_748,0x1b4,1,2,pPVar21,0xc62fdf,&local_6e4,0xc63004);
    local_758 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_750 = "";
    local_768 = &boost::unit_test::basic_cstring<char_const>::null;
    local_760 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = (iterator)pPVar21;
    msg_11.m_begin = pvVar16;
    file_11.m_end = (iterator)0x1b5;
    file_11.m_begin = (iterator)&local_758;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_768,
               msg_11);
    local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
    local_318._0_8_ = &PTR__lazy_ostream_01139f30;
    asStack_308[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    asStack_308[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_778 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_770 = "";
    std::__cxx11::string::string
              ((string *)&package_missing_parent,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iVar10._M_node[2]._M_left);
    pvVar16 = (iterator)0x2;
    pPVar21 = &package_missing_parent;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[31]>
              (local_318,&local_778,0x1b5,1,2,pPVar21,0xc6302a,"bad-txns-inputs-missingorspent",
               0xc63055);
    std::__cxx11::string::~string((string *)&package_missing_parent);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&err_parent_invalid);
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pPVar21;
  msg_12.m_begin = pvVar16;
  file_12.m_end = (iterator)0x1b7;
  file_12.m_begin = (iterator)&local_788;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_798,
             msg_12);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139f30;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7a0 = "";
  local_318._0_4_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result;
  pPVar21 = &package_missing_parent;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(package_missing_parent.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&err_parent_invalid,&local_7a8,0x1b7,1,2,(pointer)local_318,0xc63076,pPVar21,0xc62929);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_3gen_submit);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_invalid_parent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent_invalid.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent_invalid);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&bad_witness.stack);
  peVar2 = ((package_unrelated.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       *(pointer *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       *(size_type *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_child.vin,(COutPoint *)&result_3gen_submit);
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_missing_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_missing_parent,&tx_parent);
  std::make_shared<CTransaction_const,CMutableTransaction&>
            ((CMutableTransaction *)&result_3gen_submit);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&package_missing_parent,(shared_ptr<const_CTransaction> *)&result_3gen_submit);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason);
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar19 = &mtx_parent_invalid;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  pvVar16 = (iterator)0x0;
  ProcessNewPackage(&result_3gen_submit,pCVar8,
                    (((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_missing_parent,
                    false,(optional<CFeeRate> *)pCVar19);
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)pCVar19;
  msg_13.m_begin = pvVar16;
  file_13.m_end = (iterator)0x1c2;
  file_13.m_begin = (iterator)&local_7b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_7c8,
             msg_13);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_mode == M_INVALID
  ;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  local_318._0_8_ = "result_missing_parent.m_state.IsInvalid()";
  local_318._8_8_ = "";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7d0 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             (check_type)pPVar21,(size_t)&local_7d8,0x1c2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar18;
  msg_14.m_begin = pvVar16;
  file_14.m_end = (iterator)0x1c3;
  file_14.m_begin = (iterator)&local_7e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_7f8,
             msg_14);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_800 = "";
  poVar20 = &err_parent_invalid;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_4_ =
       result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.m_result;
  local_318._0_4_ = 1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&mtx_parent_invalid,&local_808,0x1c3,1,2,poVar20,0xc630c6,(pointer)local_318,0xc62342);
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)poVar20;
  msg_15.m_begin = pvVar16;
  file_15.m_end = (iterator)0x1c4;
  file_15.m_begin = (iterator)&local_818;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_828,
             msg_15);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_830 = "";
  std::__cxx11::string::string
            ((string *)&err_parent_invalid,
             &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason);
  pvVar16 = (iterator)0x2;
  poVar20 = &err_parent_invalid;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[43]>
            (&mtx_parent_invalid,&local_838,0x1c4,1,2,poVar20,0xc630f0,
             "package-not-child-with-unconfirmed-parents",0xc6314b);
  std::__cxx11::string::~string((string *)&err_parent_invalid);
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)poVar20;
  msg_16.m_begin = pvVar16;
  file_16.m_end = (iterator)0x1c5;
  file_16.m_begin = (iterator)&local_848;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_858,
             msg_16);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_860 = "";
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       CTxMemPool::size((((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  puVar24 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&mtx_parent_invalid,&local_868,0x1c5,1,2,(pointer)&err_parent_invalid,0xc629c5,puVar24,
             0xc62ea6);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_3gen_submit);
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar19 = &mtx_parent_invalid;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  pvVar16 = (iterator)0x0;
  ProcessNewPackage(&result_3gen_submit,pCVar8,
                    (((TestChain100Setup *)this)->super_TestingSetup).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_parent_child,
                    false,(optional<CFeeRate> *)pCVar19);
  expected_pool_size = expected_pool_size + 2;
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)pCVar19;
  msg_17.m_begin = pvVar16;
  file_17.m_end = (iterator)0x1ce;
  file_17.m_begin = (iterator)&local_878;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_888,
             msg_17);
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(bad_witness.stack.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
                         m_mode == M_VALID);
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bad_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_parent_invalid.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0113af50;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = anon_var_dwarf_124d7de;
  std::__cxx11::string::string
            ((string *)local_318,
             &result_3gen_submit.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113f230;
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_890 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = &DAT_00000001;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&err_parent_invalid;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bad_witness,(lazy_ostream *)&mtx_parent_invalid,1,1,WARN,
             (check_type)puVar24,(size_t)&local_898,0x1ce);
  std::__cxx11::string::~string((string *)local_318);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &bad_witness.stack.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar18;
  msg_18.m_begin = pvVar16;
  file_18.m_end = (iterator)0x1cf;
  file_18.m_begin = (iterator)&local_8a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_8b8,
             msg_18);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8c0 = "";
  poVar20 = &err_parent_invalid;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       (_Alloc_hider)
       result_3gen_submit.m_tx_results._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_318._0_8_ =
       (long)package_parent_child.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)package_parent_child.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  pvVar16 = (iterator)0x2;
  pCVar25 = (pointer)local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&mtx_parent_invalid,&local_8c8,0x1cf,1,2,poVar20,0xc631a1,(pointer)local_318,0xc631c9);
  cVar11 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&result_3gen_submit.m_tx_results._M_t,
                  &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  cVar12 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&result_3gen_submit.m_tx_results._M_t,
                  &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8d0 = "";
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = (iterator)poVar20;
  msg_19.m_begin = pvVar16;
  file_19.m_end = (iterator)0x1d2;
  file_19.m_begin = (iterator)&local_8d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_8e8,
             msg_19);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       (_Rb_tree_header *)cVar11._M_node !=
       &result_3gen_submit.m_tx_results._M_t._M_impl.super__Rb_tree_header;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  local_318._0_8_ = "it_parent != submit_parent_child.m_tx_results.end()";
  local_318._8_8_ = "";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8f0 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             (check_type)pCVar25,(size_t)&local_8f8,0x1d2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar18;
  msg_20.m_begin = pvVar16;
  file_20.m_end = (iterator)0x1d3;
  file_20.m_begin = (iterator)&local_908;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_918,
             msg_20);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = *(int *)&cVar11._M_node[2]._M_parent == 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  local_318._0_8_ = "it_parent->second.m_state.IsValid()";
  local_318._8_8_ = "";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_928 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_920 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             (check_type)pCVar25,(size_t)&local_928,0x1d3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_930 = "";
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar18;
  msg_21.m_begin = pvVar16;
  file_21.m_end = (iterator)0x1d4;
  file_21.m_begin = (iterator)&local_938;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_948,
             msg_21);
  package_invalid_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5f5e100;
  iVar13 = GetVirtualTransactionSize
                     (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  CFeeRate::CFeeRate((CFeeRate *)&bad_witness,(CAmount *)&package_invalid_parent,(uint32_t)iVar13);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       cVar11._M_node[6]._M_parent ==
       (_Base_ptr)
       bad_witness.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start & *(byte *)&cVar11._M_node[6]._M_left;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  local_318._0_8_ =
       "it_parent->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_parent))"
  ;
  local_318._8_8_ = "";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_950 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             (check_type)pCVar25,(size_t)&local_958,0x1d4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar18;
  msg_22.m_begin = pvVar16;
  file_22.m_end = (iterator)0x1d5;
  file_22.m_begin = (iterator)&local_968;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_978,
             msg_22);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_980 = "";
  pvVar14 = std::
            optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
            ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                     *)&cVar11._M_node[6]._M_right);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       ((long)(pvVar14->
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar14->
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5);
  poVar20 = &err_parent_invalid;
  local_318._0_4_ = 1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&mtx_parent_invalid,&local_988,0x1d5,1,2,poVar20,0xc6272d,(pointer)local_318,0xc69f21);
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = (iterator)poVar20;
  msg_23.m_begin = pvVar16;
  file_23.m_end = (iterator)0x1d6;
  file_23.m_begin = (iterator)&local_998;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_9a8,
             msg_23);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_9b0 = "";
  pvVar14 = std::
            optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
            ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                     *)&cVar11._M_node[6]._M_right);
  ptVar22 = (pvVar14->
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pWVar26 = &(tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_witness_hash;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
            (&mtx_parent_invalid,&local_9b8,0x1d6,1,2,ptVar22,0xc62768,pWVar26,0xc627a4);
  local_9c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = (iterator)ptVar22;
  msg_24.m_begin = pvVar16;
  file_24.m_end = (iterator)0x1d7;
  file_24.m_begin = (iterator)&local_9c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_9d8,
             msg_24);
  package_invalid_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5f5e100;
  iVar13 = GetVirtualTransactionSize
                     (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  CFeeRate::CFeeRate((CFeeRate *)&bad_witness,(CAmount *)&package_invalid_parent,(uint32_t)iVar13);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ =
       cVar12._M_node[6]._M_parent ==
       (_Base_ptr)
       bad_witness.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start & *(byte *)&cVar12._M_node[6]._M_left;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  local_318._0_8_ =
       "it_child->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_child))"
  ;
  local_318._8_8_ = "";
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_9e0 = "";
  pvVar16 = &DAT_00000001;
  pvVar18 = (iterator)0x0;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_parent_invalid,(lazy_ostream *)&mtx_parent_invalid,1,0,WARN,
             (check_type)pWVar26,(size_t)&local_9e8,0x1d7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_parent_invalid.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_9f0 = "";
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar18;
  msg_25.m_begin = pvVar16;
  file_25.m_end = (iterator)0x1d8;
  file_25.m_begin = (iterator)&local_9f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_a08,
             msg_25);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a10 = "";
  pvVar14 = std::
            optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
            ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                     *)&cVar12._M_node[6]._M_right);
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       ((long)(pvVar14->
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar14->
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5);
  poVar20 = &err_parent_invalid;
  local_318._0_4_ = 1;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&mtx_parent_invalid,&local_a18,0x1d8,1,2,poVar20,0xc62822,(pointer)local_318,0xc69f21);
  local_a28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a20 = "";
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = (iterator)poVar20;
  msg_26.m_begin = pvVar16;
  file_26.m_end = (iterator)0x1d9;
  file_26.m_begin = (iterator)&local_a28;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_a38,
             msg_26);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a40 = "";
  pvVar14 = std::
            optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
            ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                     *)&cVar12._M_node[6]._M_right);
  ptVar22 = (pvVar14->
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
            (&mtx_parent_invalid,&local_a48,0x1d9,1,2,ptVar22,0xc6285c,
             &(tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_witness_hash,0xc62897);
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = (iterator)ptVar22;
  msg_27.m_begin = pvVar16;
  file_27.m_end = (iterator)0x1db;
  file_27.m_begin = (iterator)&local_a58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_a68,
             msg_27);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a70 = "";
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       CTxMemPool::size((pTVar28->super_TestingSetup).super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  puVar24 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&mtx_parent_invalid,&local_a78,0x1db,1,2,&err_parent_invalid,0xc629c5,puVar24,0xc62ea6)
  ;
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_3gen_submit);
  pTVar23 = pTVar28;
  pCVar8 = ChainstateManager::ActiveChainstate
                     ((pTVar28->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                      m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar19 = &mtx_parent_invalid;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  ProcessNewPackage(&result_3gen_submit,pCVar8,
                    (pTVar28->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_parent_child,
                    false,(optional<CFeeRate> *)pCVar19);
  pCVar17 = (pTVar28->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
            mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_invalid,&package_parent_child,&result_3gen_submit,true,pCVar17);
  if ((char)mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish == '\x01') {
    local_a88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_a80 = "";
    local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_28.m_end = (iterator)pCVar19;
    msg_28.m_begin = (iterator)pCVar17;
    file_28.m_end = (iterator)0x1e3;
    file_28.m_begin = (iterator)&local_a88;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_a98,
               msg_28);
    local_318._0_8_ = local_318._0_8_ & 0xffffffffffffff00;
    local_318._8_8_ = (char *)0x0;
    asStack_308[0].pi_ = (sp_counted_base *)0x0;
    if ((char)mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_0054c7bb;
    }
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_parent_invalid.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01139e30;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_aa8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_aa0 = "";
    pvVar16 = &DAT_00000001;
    pvVar18 = &DAT_00000001;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &mtx_parent_invalid;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_318,(lazy_ostream *)&err_parent_invalid,1,1,WARN,
               (check_type)puVar24,(size_t)&local_aa8,0x1e3);
    boost::detail::shared_count::~shared_count(asStack_308);
  }
  else {
    cVar11 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_3gen_submit.m_tx_results._M_t,
                    &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    cVar12 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_3gen_submit.m_tx_results._M_t,
                    &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    local_ab8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ab0 = "";
    local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_29.m_end = (iterator)pCVar19;
    msg_29.m_begin = (iterator)pCVar17;
    file_29.m_end = (iterator)0x1e7;
    file_29.m_begin = (iterator)&local_ab8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_ac8,
               msg_29);
    local_318._8_8_ = (char *)0x0;
    asStack_308[0].pi_ = (sp_counted_base *)0x0;
    bad_witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d855;
    bad_witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6335a;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_parent_invalid.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0113a070;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &bad_witness;
    local_ad8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ad0 = "";
    pvVar16 = &DAT_00000001;
    pvVar18 = (iterator)0x0;
    local_318[0] = (class_property<bool>)(class_property<bool>)(cVar11._M_node[2]._M_color == 2);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_318,(lazy_ostream *)&err_parent_invalid,1,0,WARN,
               (check_type)puVar24,(size_t)&local_ad8,0x1e7);
    boost::detail::shared_count::~shared_count(asStack_308);
    local_ae8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ae0 = "";
    local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_30.m_end = pvVar18;
    msg_30.m_begin = pvVar16;
    file_30.m_end = (iterator)0x1e8;
    file_30.m_begin = (iterator)&local_ae8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_af8,
               msg_30);
    local_318[0] = (class_property<bool>)(class_property<bool>)(cVar12._M_node[2]._M_color == 2);
    local_318._8_8_ = (char *)0x0;
    asStack_308[0].pi_ = (sp_counted_base *)0x0;
    bad_witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d870;
    bad_witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc633b3;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_parent_invalid.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length & 0xffffffffffffff00;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0113a070;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_parent_invalid.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &bad_witness;
    local_b08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_b00 = "";
    pvVar16 = &DAT_00000001;
    pvVar18 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_318,(lazy_ostream *)&err_parent_invalid,1,0,WARN,
               (check_type)puVar24,(size_t)&local_b08,0x1e8);
    boost::detail::shared_count::~shared_count(asStack_308);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_invalid);
  local_b18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_b10 = "";
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b20 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar18;
  msg_31.m_begin = pvVar16;
  file_31.m_end = (iterator)0x1eb;
  file_31.m_begin = (iterator)&local_b18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_b28,
             msg_31);
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_invalid.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_invalid.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  err_parent_invalid.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       CTxMemPool::size((pTVar23->super_TestingSetup).super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&mtx_parent_invalid,&stack0xfffffffffffff4c8,0x1eb,1,2,&err_parent_invalid,0xc629c5,
             &expected_pool_size,0xc62ea6);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_3gen_submit);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_missing_parent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_grandchild);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&grandchild_locking_script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&grandchild_key.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&child_locking_script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&child_key.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_3gen);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_parent_child);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&result_unrelated_submit);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_unrelated);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&parent_locking_script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&parent_key.keydata);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0054c7bb:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_submission_tests)
{
    LOCK(cs_main);
    unsigned int expected_pool_size = m_node.mempool->size();
    CKey parent_key = GenerateRandomKey();
    CScript parent_locking_script = GetScriptForDestination(PKHash(parent_key.GetPubKey()));

    // Unrelated transactions are not allowed in package submission.
    Package package_unrelated;
    for (size_t i{0}; i < 10; ++i) {
        auto mtx = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[i + 25], /*input_vout=*/0,
                                                 /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                 /*output_destination=*/parent_locking_script,
                                                 /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
        package_unrelated.emplace_back(MakeTransactionRef(mtx));
    }
    auto result_unrelated_submit = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                     package_unrelated, /*test_accept=*/false, /*client_maxfeerate=*/{});
    // We don't expect m_tx_results for each transaction when basic sanity checks haven't passed.
    BOOST_CHECK(result_unrelated_submit.m_state.IsInvalid());
    BOOST_CHECK_EQUAL(result_unrelated_submit.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(result_unrelated_submit.m_state.GetRejectReason(), "package-not-child-with-parents");
    BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

    // Parent and Child (and Grandchild) Package
    Package package_parent_child;
    Package package_3gen;
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_locking_script,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
    package_parent_child.push_back(tx_parent);
    package_3gen.push_back(tx_parent);

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(PKHash(child_key.GetPubKey()));
    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/parent_key,
                                                   /*output_destination=*/child_locking_script,
                                                   /*output_amount=*/CAmount(48 * COIN), /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    package_parent_child.push_back(tx_child);
    package_3gen.push_back(tx_child);

    CKey grandchild_key = GenerateRandomKey();
    CScript grandchild_locking_script = GetScriptForDestination(PKHash(grandchild_key.GetPubKey()));
    auto mtx_grandchild = CreateValidMempoolTransaction(/*input_transaction=*/tx_child, /*input_vout=*/0,
                                                       /*input_height=*/101, /*input_signing_key=*/child_key,
                                                       /*output_destination=*/grandchild_locking_script,
                                                       /*output_amount=*/CAmount(47 * COIN), /*submit=*/false);
    CTransactionRef tx_grandchild = MakeTransactionRef(mtx_grandchild);
    package_3gen.push_back(tx_grandchild);

    // 3 Generations is not allowed.
    {
        auto result_3gen_submit = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                    package_3gen, /*test_accept=*/false, /*client_maxfeerate=*/{});
        BOOST_CHECK(result_3gen_submit.m_state.IsInvalid());
        BOOST_CHECK_EQUAL(result_3gen_submit.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(result_3gen_submit.m_state.GetRejectReason(), "package-not-child-with-parents");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Parent and child package where transactions are invalid for reasons other than fee and
    // missing inputs, so the package validation isn't expected to happen.
    {
        CScriptWitness bad_witness;
        bad_witness.stack.emplace_back(1);
        CMutableTransaction mtx_parent_invalid{mtx_parent};
        mtx_parent_invalid.vin[0].scriptWitness = bad_witness;
        CTransactionRef tx_parent_invalid = MakeTransactionRef(mtx_parent_invalid);
        Package package_invalid_parent{tx_parent_invalid, tx_child};
        auto result_quit_early = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_invalid_parent, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_parent_invalid{CheckPackageMempoolAcceptResult(package_invalid_parent, result_quit_early, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_parent_invalid.value());
        } else {
            auto it_parent = result_quit_early.m_tx_results.find(tx_parent_invalid->GetWitnessHash());
            auto it_child = result_quit_early.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK_EQUAL(it_parent->second.m_state.GetResult(), TxValidationResult::TX_WITNESS_MUTATED);
            BOOST_CHECK_EQUAL(it_parent->second.m_state.GetRejectReason(), "bad-witness-nonstandard");
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetResult(), TxValidationResult::TX_MISSING_INPUTS);
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetRejectReason(), "bad-txns-inputs-missingorspent");
        }
        BOOST_CHECK_EQUAL(result_quit_early.m_state.GetResult(), PackageValidationResult::PCKG_TX);
    }

    // Child with missing parent.
    mtx_child.vin.emplace_back(COutPoint(package_unrelated[0]->GetHash(), 0));
    Package package_missing_parent;
    package_missing_parent.push_back(tx_parent);
    package_missing_parent.push_back(MakeTransactionRef(mtx_child));
    {
        const auto result_missing_parent = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                             package_missing_parent, /*test_accept=*/false, /*client_maxfeerate=*/{});
        BOOST_CHECK(result_missing_parent.m_state.IsInvalid());
        BOOST_CHECK_EQUAL(result_missing_parent.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(result_missing_parent.m_state.GetRejectReason(), "package-not-child-with-unconfirmed-parents");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Submit package with parent + child.
    {
        const auto submit_parent_child = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                           package_parent_child, /*test_accept=*/false, /*client_maxfeerate=*/{});
        expected_pool_size += 2;
        BOOST_CHECK_MESSAGE(submit_parent_child.m_state.IsValid(),
                            "Package validation unexpectedly failed: " << submit_parent_child.m_state.GetRejectReason());
        BOOST_CHECK_EQUAL(submit_parent_child.m_tx_results.size(), package_parent_child.size());
        auto it_parent = submit_parent_child.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child = submit_parent_child.m_tx_results.find(tx_child->GetWitnessHash());
        BOOST_CHECK(it_parent != submit_parent_child.m_tx_results.end());
        BOOST_CHECK(it_parent->second.m_state.IsValid());
        BOOST_CHECK(it_parent->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_parent)));
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().front(), tx_parent->GetWitnessHash());
        BOOST_CHECK(it_child->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_child)));
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().front(), tx_child->GetWitnessHash());

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Already-in-mempool transactions should be detected and de-duplicated.
    {
        const auto submit_deduped = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                      package_parent_child, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_deduped{CheckPackageMempoolAcceptResult(package_parent_child, submit_deduped, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_deduped.value());
        } else {
            auto it_parent_deduped = submit_deduped.m_tx_results.find(tx_parent->GetWitnessHash());
            auto it_child_deduped = submit_deduped.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK(it_parent_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        }

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }
}